

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

ethash_h256_t * stringToBlockhash(ethash_h256_t *__return_storage_ptr__,string *_s)

{
  uchar *__src;
  size_type __n;
  ethash_h256_t *ret;
  undefined1 local_28 [8];
  bytes b;
  string *_s_local;
  
  b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)_s;
  hexStringToBytes((bytes *)local_28,_s);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  memcpy(__return_storage_ptr__,__src,__n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

ethash_h256_t stringToBlockhash(std::string const& _s)
{
	ethash_h256_t ret;
	bytes b = hexStringToBytes(_s);
	memcpy(&ret, b.data(), b.size());
	return ret;
}